

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::exception<ki::protocol::runtime_error>::exception
          (exception<ki::protocol::runtime_error> *this,handle scope,char *name,PyObject *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  exception<ki::protocol::runtime_error> *peVar3;
  int iVar4;
  detail *this_00;
  undefined8 *puVar5;
  long *plVar6;
  PyObject *pPVar7;
  long *plVar8;
  size_type *psVar9;
  handle *handle;
  undefined8 uVar10;
  ulong uVar11;
  string full_name;
  undefined1 local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  exception<ki::protocol::runtime_error> *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  local_50.key = "__name__";
  local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_78 = this;
  local_50.obj.m_ptr = scope.m_ptr;
  this_00 = (detail *)
            detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_50);
  detail::load_type<std::__cxx11::string>
            ((make_caster<std::__cxx11::basic_string<char>_> *)local_d8,this_00,handle);
  paVar1 = &local_98.field_2;
  pcVar2 = local_d8 + 0x10;
  if ((pointer)local_d8._0_8_ == pcVar2) {
    local_98.field_2._8_4_ = local_d8._24_4_;
    local_98.field_2._12_4_ = local_d8._28_4_;
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_d8._0_8_;
  }
  local_98.field_2._M_allocated_capacity = local_d8._16_8_;
  local_98._M_string_length = local_d8._8_8_;
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,".","");
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    uVar10 = local_98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_d8._8_8_ + local_98._M_string_length) {
    uVar11 = 0xf;
    if ((pointer)local_d8._0_8_ != pcVar2) {
      uVar11 = local_d8._16_8_;
    }
    if (local_d8._8_8_ + local_98._M_string_length <= uVar11) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)local_d8,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
      goto LAB_0012a602;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,local_d8._0_8_);
LAB_0012a602:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar9 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_b8.field_2._M_allocated_capacity = *psVar9;
    local_b8.field_2._8_8_ = puVar5[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar9;
    local_b8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_b8._M_string_length = puVar5[1];
  *puVar5 = psVar9;
  puVar5[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_70 = &local_60;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar6[3];
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  object::~object(&local_50.cache);
  peVar3 = local_78;
  pPVar7 = (PyObject *)PyErr_NewException(local_70,base,0);
  (peVar3->super_object).super_handle.m_ptr = pPVar7;
  iVar4 = PyObject_HasAttrString(scope.m_ptr,name);
  if (iVar4 != 1) {
    local_d8._24_8_ = 0;
    local_d8._8_8_ = scope.m_ptr;
    local_d8._16_8_ = name;
    detail::accessor_policies::str_attr::set(scope,name,(peVar3->super_object).super_handle.m_ptr);
    object::~object((object *)(local_d8 + 0x18));
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    return;
  }
  std::__cxx11::string::string((string *)&local_98,name,(allocator *)&local_50);
  std::operator+(&local_b8,
                 "Error during initialization: multiple incompatible definitions with name \"",
                 &local_98);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_d8._0_8_ = *plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_d8._0_8_ == psVar9) {
    local_d8._16_8_ = *psVar9;
    local_d8._24_8_ = plVar6[3];
    local_d8._0_8_ = pcVar2;
  }
  else {
    local_d8._16_8_ = *psVar9;
  }
  local_d8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pybind11_fail((string *)local_d8);
}

Assistant:

exception(handle scope, const char *name, PyObject *base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base, NULL);
        if (hasattr(scope, name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }